

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialAssetId::ConfidentialAssetId(ConfidentialAssetId *this,string *hex_string)

{
  ByteData *this_00;
  uint8_t uVar1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  size_t sVar2;
  CfdException *pCVar3;
  undefined1 local_80 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_30;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_28;
  
  this->_vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00276fd0;
  this_00 = &this->data_;
  ByteData::ByteData(this_00,hex_string);
  this->version_ = '\x01';
  sVar2 = ByteData::GetDataSize(this_00);
  if (sVar2 == 0x20) {
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,this_00);
    local_30.current._M_current =
         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          )(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            )local_80._0_8_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&buffer,&local_28,&local_30,
               (allocator_type *)&local_48);
    ByteData::ByteData((ByteData *)&local_48,&buffer);
  }
  else {
    if (sVar2 != 0x21) {
      if (sVar2 == 0) {
        local_80._0_8_ = "cfdcore_elements_transaction.cpp";
        local_80._8_4_ = 0x161;
        local_80._16_8_ = "ConfidentialAssetId";
        logger::warn<std::__cxx11::string_const&>
                  ((CfdSourceLocation *)local_80,"Empty ConfidentialAssetId. hex_string={}.",
                   hex_string);
        pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_80,"Empty AssetId is invalid.",(allocator *)&buffer);
        CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
        __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_80._0_8_ = "cfdcore_elements_transaction.cpp";
      local_80._8_4_ = 0x17a;
      local_80._16_8_ = "ConfidentialAssetId";
      buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ByteData::GetDataSize(this_00);
      logger::warn<unsigned_long>
                ((CfdSourceLocation *)local_80,"AssetId size Invalid. size={}.",
                 (unsigned_long *)&buffer);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_80,"AssetId size Invalid.",(allocator *)&buffer);
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_80);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,this_00);
    __last._M_current._4_4_ = local_80._12_4_;
    __last._M_current._0_4_ = local_80._8_4_;
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&buffer,
               (uchar *)(local_80._0_8_ + 1),__last,(allocator_type *)&local_48);
    uVar1 = *(uint8_t *)local_80._0_8_;
    this->version_ = uVar1;
    if (uVar1 == '\0') {
      ByteData::ByteData((ByteData *)&local_48);
    }
    else {
      ByteData::ByteData((ByteData *)&local_48,&buffer);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,&local_48);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  CheckVersion(this->version_);
  return;
}

Assistant:

ConfidentialAssetId::ConfidentialAssetId(const std::string &hex_string)
    : data_(hex_string), version_(kConfidentialVersion_1) {
  switch (data_.GetDataSize()) {
    case 0:
      warn(
          CFD_LOG_SOURCE, "Empty ConfidentialAssetId. hex_string={}.",
          hex_string);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Empty AssetId is invalid.");
      break;
    case kAssetSize: {
      // reverse
      const std::vector<uint8_t> &data = data_.GetBytes();
      std::vector<uint8_t> reverse_buffer(data.crbegin(), data.crend());
      data_ = ByteData(reverse_buffer);
      break;
    }
    case kConfidentialDataSize: {
      const std::vector<uint8_t> &data = data_.GetBytes();
      std::vector<uint8_t> buffer(data.cbegin() + 1, data.cend());
      version_ = data[0];
      if (version_ == 0) {
        data_ = ByteData();
      } else {
        data_ = ByteData(buffer);
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "AssetId size Invalid. size={}.",
          data_.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "AssetId size Invalid.");
  }
  CheckVersion(version_);
}